

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ecmult_impl.h
# Opt level: O1

void secp256k1_ecmult_endo_split
               (secp256k1_scalar *s1,secp256k1_scalar *s2,secp256k1_ge *p1,secp256k1_ge *p2)

{
  uint uVar1;
  long lVar2;
  uint uVar3;
  uint uVar4;
  secp256k1_ge *psVar5;
  secp256k1_ge *psVar6;
  byte bVar7;
  secp256k1_scalar tmp;
  secp256k1_scalar local_58;
  
  bVar7 = 0;
  local_58.d[0] = s1->d[0];
  local_58.d[1] = s1->d[1];
  local_58.d[2] = s1->d[2];
  local_58.d[3] = s1->d[3];
  secp256k1_scalar_split_lambda(s1,s2,&local_58);
  psVar5 = p1;
  psVar6 = p2;
  for (lVar2 = 0xb; lVar2 != 0; lVar2 = lVar2 + -1) {
    (psVar6->x).n[0] = (psVar5->x).n[0];
    psVar5 = (secp256k1_ge *)((long)psVar5 + (ulong)bVar7 * -0x10 + 8);
    psVar6 = (secp256k1_ge *)((long)psVar6 + (ulong)bVar7 * -0x10 + 8);
  }
  secp256k1_fe_impl_mul(&p2->x,&p2->x,&secp256k1_const_beta);
  uVar1 = -(int)((long)s1->d[3] >> 0x3f);
  uVar3 = uVar1 ^ 1;
  uVar4 = uVar3;
  if (s1->d[2] == 0xffffffffffffffff) {
    uVar4 = 0;
  }
  if (0x5d576e7357a4501c < s1->d[1]) {
    uVar3 = 0;
  }
  uVar3 = (uVar3 | uVar4 | s1->d[3] < 0x7fffffffffffffff) ^ 1;
  uVar4 = 0;
  if (0xdfe92f46681b20a0 < s1->d[0]) {
    uVar4 = uVar3;
  }
  if (0x5d576e7357a4501d < s1->d[1]) {
    uVar4 = uVar3;
  }
  if (uVar4 != 0 || uVar1 != 0) {
    secp256k1_scalar_negate(s1,s1);
    secp256k1_ge_neg(p1,p1);
  }
  uVar1 = -(int)((long)s2->d[3] >> 0x3f);
  uVar3 = uVar1 ^ 1;
  uVar4 = uVar3;
  if (s2->d[2] == 0xffffffffffffffff) {
    uVar4 = 0;
  }
  if (0x5d576e7357a4501c < s2->d[1]) {
    uVar3 = 0;
  }
  uVar3 = (uVar3 | uVar4 | s2->d[3] < 0x7fffffffffffffff) ^ 1;
  uVar4 = 0;
  if (0xdfe92f46681b20a0 < s2->d[0]) {
    uVar4 = uVar3;
  }
  if (0x5d576e7357a4501d < s2->d[1]) {
    uVar4 = uVar3;
  }
  if (uVar4 != 0 || uVar1 != 0) {
    secp256k1_scalar_negate(s2,s2);
    secp256k1_ge_neg(p2,p2);
  }
  return;
}

Assistant:

SECP256K1_INLINE static void secp256k1_ecmult_endo_split(secp256k1_scalar *s1, secp256k1_scalar *s2, secp256k1_ge *p1, secp256k1_ge *p2) {
    secp256k1_scalar tmp = *s1;
    secp256k1_scalar_split_lambda(s1, s2, &tmp);
    secp256k1_ge_mul_lambda(p2, p1);

    if (secp256k1_scalar_is_high(s1)) {
        secp256k1_scalar_negate(s1, s1);
        secp256k1_ge_neg(p1, p1);
    }
    if (secp256k1_scalar_is_high(s2)) {
        secp256k1_scalar_negate(s2, s2);
        secp256k1_ge_neg(p2, p2);
    }
}